

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O2

void __thiscall BamTools::MergeTool::MergeTool(MergeTool *this)

{
  MergeSettings *this_00;
  OptionGroup *group;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__MergeTool_001f2118;
  this_00 = (MergeSettings *)operator_new(0x80);
  MergeSettings::MergeSettings(this_00);
  this->m_settings = this_00;
  this->m_impl = (MergeToolPrivate *)0x0;
  std::__cxx11::string::string((string *)&local_90,"bamtools merge",(allocator *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"merges multiple BAM files into one",&local_93);
  std::__cxx11::string::string
            ((string *)&local_50,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename> | [-forceCompression]] [-region <REGION>]"
             ,&local_94);
  Options::SetProgramInfo(&local_90,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"Input & Output",(allocator *)&local_70);
  group = Options::CreateOptionGroup(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"-in",&local_93);
  std::__cxx11::string::string((string *)&local_70,"BAM filename",&local_94);
  std::__cxx11::string::string((string *)&local_50,"the input BAM file(s)",&local_91);
  std::__cxx11::string::string((string *)&local_30,"",&local_92);
  Options::AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_90,&local_70,&local_50,&local_30,&this->m_settings->HasInput,
             &this->m_settings->InputFiles,group);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"-list",&local_93);
  std::__cxx11::string::string((string *)&local_70,"filename",&local_94);
  std::__cxx11::string::string
            ((string *)&local_50,"the input BAM file list, one line per file",&local_91);
  std::__cxx11::string::string((string *)&local_30,"",&local_92);
  Options::AddValueOption<std::__cxx11::string>
            (&local_90,&local_70,&local_50,&local_30,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,group);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"-out",&local_93);
  std::__cxx11::string::string((string *)&local_70,"BAM filename",&local_94);
  std::__cxx11::string::string((string *)&local_50,"the output BAM file",&local_91);
  std::__cxx11::string::string((string *)&local_30,"",&local_92);
  Options::AddValueOption<std::__cxx11::string>
            (&local_90,&local_70,&local_50,&local_30,&this->m_settings->HasOutput,
             &this->m_settings->OutputFilename,group);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"-forceCompression",(allocator *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_70,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,(allocator *)&local_30);
  Options::AddOption(&local_90,&local_70,&this->m_settings->IsForceCompression,group);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"-region",&local_93);
  std::__cxx11::string::string((string *)&local_70,"REGION",&local_94);
  std::__cxx11::string::string
            ((string *)&local_50,"genomic region. See README for more details",&local_91);
  std::__cxx11::string::string((string *)&local_30,"",&local_92);
  Options::AddValueOption<std::__cxx11::string>
            (&local_90,&local_70,&local_50,&local_30,&this->m_settings->HasRegion,
             &this->m_settings->Region,group);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

MergeTool::MergeTool()
    : AbstractTool()
    , m_settings(new MergeSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools merge", "merges multiple BAM files into one",
                            "[-in <filename> -in <filename> ... | -list <filelist>] [-out "
                            "<filename> | [-forceCompression]] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts);
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts);
    Options::AddOption("-forceCompression",
                       "if results are sent to stdout (like when piping to another tool), default "
                       "behavior is to leave output uncompressed. Use this flag to override and "
                       "force compression",
                       m_settings->IsForceCompression, IO_Opts);
    Options::AddValueOption("-region", "REGION", "genomic region. See README for more details", "",
                            m_settings->HasRegion, m_settings->Region, IO_Opts);
}